

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_binder.cpp
# Opt level: O2

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::ExpressionBinder::Bind
          (ExpressionBinder *this,
          unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *expr,optional_ptr<duckdb::LogicalType,_true> result_type,bool root_expression)

{
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var1;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var2;
  _func_int **pp_Var3;
  undefined8 uVar4;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> uVar5;
  bool bVar6;
  BaseExpression *pBVar7;
  BoundExpression *pBVar8;
  type expr_00;
  pointer pEVar9;
  LogicalType *this_00;
  ParameterNotResolvedException *this_01;
  undefined7 in_register_00000009;
  bool in_R8B;
  allocator local_269;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_268;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_260;
  undefined1 local_258 [32];
  optional_ptr<duckdb::LogicalType,_true> result_type_local;
  BindResult result;
  ErrorData error_msg;
  ErrorData local_128;
  ErrorData local_a8;
  
  result_type_local.ptr = (LogicalType *)CONCAT71(in_register_00000009,root_expression);
  Bind(&error_msg,(ExpressionBinder *)expr,
       (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *)
       result_type.ptr,0,in_R8B);
  if (error_msg.initialized == true) {
    ErrorData::ErrorData(&local_128,&error_msg);
    BindCorrelatedColumns
              (&result,(ExpressionBinder *)expr,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)result_type.ptr,&local_128);
    ErrorData::~ErrorData(&local_128);
    if (result.error.initialized == true) {
      ErrorData::ErrorData(&local_a8,&result.error);
      CombineErrors(&error_msg,&local_a8);
      ErrorData::~ErrorData(&local_a8);
      ::std::__cxx11::string::string((string *)local_258,anon_var_dwarf_4b0ffdd + 9,&local_269);
      ErrorData::Throw(&error_msg,(string *)local_258);
    }
    pBVar7 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                            *)result_type.ptr)->super_BaseExpression;
    pBVar8 = BaseExpression::Cast<duckdb::BoundExpression>(pBVar7);
    _Var1._M_head_impl =
         expr[7].
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    expr_00 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator*(&pBVar8->expr);
    ExtractCorrelatedExpressions((Binder *)_Var1._M_head_impl,expr_00);
    BindResult::~BindResult(&result);
  }
  pBVar7 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
            ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                          *)result_type.ptr)->super_BaseExpression;
  pBVar8 = BaseExpression::Cast<duckdb::BoundExpression>(pBVar7);
  _Var2._M_head_impl =
       (pBVar8->expr).super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
       ._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
       _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  this->_vptr_ExpressionBinder = (_func_int **)_Var2._M_head_impl;
  (pBVar8->expr).super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
  .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
  if (*(char *)&expr[1].
                super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                ._M_t.
                super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl == '\0') {
    if (*(char *)((long)expr[7].
                        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                        ._M_t.
                        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl[9].
                        super_BaseExpression.alias.field_2._M_local_buf + 0xb) == '\0') {
      pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           *)this);
      bVar6 = ContainsNullType(&pEVar9->return_type);
      if (bVar6) {
        pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                             *)this);
        ExchangeNullType((LogicalType *)&result,&pEVar9->return_type);
        _Var1._M_head_impl =
             expr[8].
             super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
             ._M_t.
             super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
             .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
        local_268._M_head_impl = (Expression *)this->_vptr_ExpressionBinder;
        this->_vptr_ExpressionBinder = (_func_int **)0x0;
        BoundCastExpression::AddCastToType
                  ((BoundCastExpression *)local_258,(ClientContext *)_Var1._M_head_impl,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_268,(LogicalType *)&result,false);
        uVar4 = local_258._0_8_;
        local_258._0_8_ = (_func_int **)0x0;
        pp_Var3 = this->_vptr_ExpressionBinder;
        this->_vptr_ExpressionBinder = (_func_int **)uVar4;
        if (pp_Var3 != (_func_int **)0x0) {
          (**(code **)(*pp_Var3 + 8))();
          if ((_func_int **)local_258._0_8_ != (_func_int **)0x0) {
            (**(code **)(*(_func_int **)local_258._0_8_ + 8))();
          }
        }
        local_258._0_8_ = (_func_int **)0x0;
        if (local_268._M_head_impl != (Expression *)0x0) {
          (*((local_268._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
        local_268._M_head_impl = (Expression *)0x0;
        LogicalType::~LogicalType((LogicalType *)&result);
      }
    }
    pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)this);
    if ((pEVar9->return_type).id_ == UNKNOWN) {
      this_01 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
      ParameterNotResolvedException::ParameterNotResolvedException(this_01);
      __cxa_throw(this_01,&ParameterNotResolvedException::typeinfo,
                  ::std::runtime_error::~runtime_error);
    }
  }
  else {
    _Var1._M_head_impl =
         expr[8].
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    this->_vptr_ExpressionBinder = (_func_int **)0x0;
    local_260._M_head_impl = _Var2._M_head_impl;
    BoundCastExpression::AddCastToType
              ((BoundCastExpression *)&result,(ClientContext *)_Var1._M_head_impl,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_260,(LogicalType *)(expr + 1),false);
    uVar5 = result.expression;
    result.expression.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
    ._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>)
         0x0;
    pp_Var3 = this->_vptr_ExpressionBinder;
    this->_vptr_ExpressionBinder =
         (_func_int **)
         uVar5.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    if (pp_Var3 != (_func_int **)0x0) {
      (**(code **)(*pp_Var3 + 8))();
      if (result.expression.
          super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
          (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>)
          0x0) {
        (**(code **)(*(long *)result.expression.
                              super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                              ._M_t.
                              super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                              .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl + 8))
                  ();
      }
    }
    result.expression.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
    ._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>)
         0x0;
    if (local_260._M_head_impl != (Expression *)0x0) {
      (*((local_260._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    local_260._M_head_impl = (Expression *)0x0;
  }
  if ((LogicalType *)CONCAT71(in_register_00000009,root_expression) != (LogicalType *)0x0) {
    pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)this);
    this_00 = optional_ptr<duckdb::LogicalType,_true>::operator*(&result_type_local);
    LogicalType::operator=(this_00,&pEVar9->return_type);
  }
  ErrorData::~ErrorData(&error_msg);
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> ExpressionBinder::Bind(unique_ptr<ParsedExpression> &expr, optional_ptr<LogicalType> result_type,
                                              bool root_expression) {
	// bind the main expression
	auto error_msg = Bind(expr, 0, root_expression);
	if (error_msg.HasError()) {
		// Try binding the correlated column. If binding the correlated column
		// has error messages, those should be propagated up. So for the test case
		// having subquery failed to bind:14 the real error message should be something like
		// aggregate with constant input must be bound to a root node.
		auto result = BindCorrelatedColumns(expr, error_msg);
		if (result.HasError()) {
			CombineErrors(error_msg, std::move(result.error));
			error_msg.Throw();
		}
		auto &bound_expr = expr->Cast<BoundExpression>();
		ExtractCorrelatedExpressions(binder, *bound_expr.expr);
	}
	auto &bound_expr = expr->Cast<BoundExpression>();
	unique_ptr<Expression> result = std::move(bound_expr.expr);
	if (target_type.id() != LogicalTypeId::INVALID) {
		// the binder has a specific target type: add a cast to that type
		result = BoundCastExpression::AddCastToType(context, std::move(result), target_type);
	} else {
		if (!binder.can_contain_nulls) {
			// SQL NULL type is only used internally in the binder
			// cast to INTEGER if we encounter it outside of the binder
			if (ContainsNullType(result->return_type)) {
				auto exchanged_type = ExchangeNullType(result->return_type);
				result = BoundCastExpression::AddCastToType(context, std::move(result), exchanged_type);
			}
		}
		if (result->return_type.id() == LogicalTypeId::UNKNOWN) {
			throw ParameterNotResolvedException();
		}
	}
	if (result_type) {
		*result_type = result->return_type;
	}
	return result;
}